

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

bool __thiscall xscript::parser::ast::predict_expression_statement(ast *this)

{
  uint uVar1;
  token_t_conflict tVar2;
  bool bVar3;
  
  tVar2 = (this->cur_token).type;
  bVar3 = true;
  uVar1 = tVar2 - TK_INC;
  if (((0x33 < uVar1) || ((0x8000000000103U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (tVar2 != TK_IDENTIFIER)) {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ast::predict_expression_statement() {
    switch (cur_token.type){
        case tokenizer::TK_IDENTIFIER:
        case tokenizer::TK_INC:
        case tokenizer::TK_DEC:
        case tokenizer::TK_LEFT_PAREN:
        case tokenizer::TK_CO:
            return true;
        default:
            return false;
    }
}